

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall
QListWidget::setSelectionModel(QListWidget *this,QItemSelectionModel *selectionModel)

{
  long lVar1;
  bool bVar2;
  offset_in_QItemSelectionModel_to_subr signal;
  long lVar3;
  offset_in_QItemSelectionModel_to_subr signal_00;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  for (lVar3 = 0x610; lVar3 != 0x620; lVar3 = lVar3 + 8) {
    QObject::disconnect((Connection *)(lVar1 + lVar3));
  }
  QAbstractItemView::setSelectionModel((QAbstractItemView *)this,selectionModel);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 800));
  if (bVar2) {
    lVar3 = *(long *)(lVar1 + 800);
    if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
      signal = 0;
    }
    else {
      signal = *(offset_in_QItemSelectionModel_to_subr *)(lVar1 + 0x328);
    }
    signal_00 = 0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QListWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
              ((Object *)local_38,signal,(Object *)QItemSelectionModel::currentChanged,0,
               (ConnectionType)lVar1);
    if (*(long *)(lVar1 + 800) != 0) {
      if (*(int *)(*(long *)(lVar1 + 800) + 4) == 0) {
        signal_00 = 0;
      }
      else {
        signal_00 = *(offset_in_QItemSelectionModel_to_subr *)(lVar1 + 0x328);
      }
    }
    QObject::
    connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QListWidget::*)()>
              ((Object *)(local_38 + 8),signal_00,
               (ContextType *)QItemSelectionModel::selectionChanged,
               (offset_in_QListWidget_to_subr *)0x0,(ConnectionType)this);
    std::array<QMetaObject::Connection,_2UL>::operator=
              ((array<QMetaObject::Connection,_2UL> *)(lVar1 + 0x610),
               (array<QMetaObject::Connection,_2UL> *)local_38);
    std::array<QMetaObject::Connection,_2UL>::~array
              ((array<QMetaObject::Connection,_2UL> *)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidget::setSelectionModel(QItemSelectionModel *selectionModel)
{
    Q_D(QListWidget);

    for (const QMetaObject::Connection &connection : d->selectionModelConnections)
        disconnect(connection);

    QListView::setSelectionModel(selectionModel);

    if (d->selectionModel) {
        d->selectionModelConnections = {
            QObjectPrivate::connect(d->selectionModel, &QItemSelectionModel::currentChanged,
                                    d, &QListWidgetPrivate::emitCurrentItemChanged),
            QObject::connect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                             this, &QListWidget::itemSelectionChanged)
        };
    }
}